

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O3

bool __thiscall asl::Socket_::waitInput(Socket_ *this,double t)

{
  ulong uVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  timeval to;
  fd_set rset;
  timeval local_b8;
  fd_set local_a8;
  
  if (-1 < *(int *)&(this->super_SmartObject_).field_0xc) {
    iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[0xc])();
    bVar7 = true;
    if (iVar3 < 1) {
      if (iVar3 < 0) {
        this->_error = 6;
      }
      else {
        dVar2 = floor(t);
        local_b8.tv_sec._0_4_ = (int)dVar2;
        local_b8.tv_usec._0_4_ = (int)((t - dVar2) * 1000000.0);
        local_b8.tv_sec._4_4_ = -(uint)((int)local_b8.tv_sec < 0);
        local_b8.tv_usec._4_4_ = -(uint)((int)local_b8.tv_usec < 0);
        local_a8.fds_bits[0] = 0;
        local_a8.fds_bits[1] = 0;
        local_a8.fds_bits[2] = 0;
        local_a8.fds_bits[3] = 0;
        local_a8.fds_bits[4] = 0;
        local_a8.fds_bits[5] = 0;
        local_a8.fds_bits[6] = 0;
        local_a8.fds_bits[7] = 0;
        local_a8.fds_bits[8] = 0;
        local_a8.fds_bits[9] = 0;
        local_a8.fds_bits[10] = 0;
        local_a8.fds_bits[0xb] = 0;
        local_a8.fds_bits[0xc] = 0;
        local_a8.fds_bits[0xd] = 0;
        local_a8.fds_bits[0xe] = 0;
        local_a8.fds_bits[0xf] = 0;
        iVar4 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        iVar5 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        iVar3 = iVar5 + 0x3f;
        if (-1 < iVar5) {
          iVar3 = iVar5;
        }
        local_a8.fds_bits[iVar3 >> 6] = local_a8.fds_bits[iVar3 >> 6] | 1L << ((byte)iVar4 & 0x3f);
        iVar3 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
        iVar3 = select(iVar3 + 1,&local_a8,(fd_set *)0x0,(fd_set *)0x0,&local_b8);
        if (iVar3 < 0) {
          this->_error = 7;
          bVar7 = true;
        }
        else {
          iVar4 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
          iVar3 = iVar4 + 0x3f;
          if (-1 < iVar4) {
            iVar3 = iVar4;
          }
          uVar1 = local_a8.fds_bits[iVar3 >> 6];
          uVar6 = (*(this->super_SmartObject_)._vptr_SmartObject_[4])(this);
          bVar7 = (uVar1 >> ((ulong)uVar6 & 0x3f) & 1) != 0;
        }
      }
    }
    return bVar7;
  }
  return false;
}

Assistant:

bool Socket_::waitInput(double t)
{
	if (_handle < 0)
		return false;
	int a = available();
	if (a > 0)
		return true;
	if (a < 0)
	{
		_error = SOCKET_BAD_DATA;
		return true;
	}
	fd_set rset;
	timeval to;
	to.tv_sec = (int)floor(t);
	to.tv_usec = (int)((t-floor(t))*1e6);
	FD_ZERO(&rset);
	FD_SET(handle(), &rset);
	if(select(handle()+1, &rset, 0, 0, &to) >= 0)
		return FD_ISSET(handle(), &rset)!=0;
	_error = SOCKET_BAD_WAIT;
	return true;
}